

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

char * mi_heap_realpath(mi_heap_t *heap,char *fname,char *resolved_name)

{
  mi_heap_t *heap_00;
  char *in_RDX;
  char *in_RSI;
  char *result;
  char *rname;
  char *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  if (in_RDX == (char *)0x0) {
    heap_00 = (mi_heap_t *)realpath(in_RSI,(char *)0x0);
    if (heap_00 == (mi_heap_t *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      local_8 = mi_heap_strdup(heap_00,in_stack_ffffffffffffffd0);
      mi_cfree((void *)0xac1d15);
    }
  }
  else {
    local_8 = realpath(in_RSI,in_RDX);
  }
  return local_8;
}

Assistant:

char* mi_heap_realpath(mi_heap_t* heap, const char* fname, char* resolved_name) mi_attr_noexcept {
  if (resolved_name != NULL) {
    return realpath(fname,resolved_name);
  }
  else {
    char* rname = realpath(fname, NULL);
    if (rname == NULL) return NULL;
    char* result = mi_heap_strdup(heap, rname);
    mi_cfree(rname);  // use checked free (which may be redirected to our free but that's ok)
    // note: with ASAN realpath is intercepted and mi_cfree may leak the returned pointer :-(
    return result;
  }
  /*
    const size_t n  = mi_path_max();
    char* buf = (char*)mi_malloc(n+1);
    if (buf == NULL) {
      errno = ENOMEM;
      return NULL;
    }
    char* rname  = realpath(fname,buf);
    char* result = mi_heap_strndup(heap,rname,n); // ok if `rname==NULL`
    mi_free(buf);
    return result;
  }
  */
}